

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_create.cpp
# Opt level: O3

bool CreateHddImage(string *path,int nSizeMB_)

{
  bool bVar1;
  exception *this;
  long llTotalBytes_;
  bool bVar2;
  shared_ptr<HDD> hdd;
  undefined1 local_28 [16];
  
  llTotalBytes_ = opt.sectors << 9;
  if (opt.sectors == -1) {
    llTotalBytes_ = (long)nSizeMB_ << 0x14;
  }
  if (llTotalBytes_ < 0x400000) {
    this = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[53]>
              (this,(char (*) [53])"needs image size in MB (>=4) or sector count with -s");
    __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
  }
  HDD::CreateDisk((HDD *)local_28,path,llTotalBytes_,(IDENTIFYDEVICE *)0x0,false);
  if ((HDD *)local_28._0_8_ == (HDD *)0x0) {
    Error("create");
  }
  else {
    bVar1 = HDD::Copy((HDD *)local_28._0_8_,(HDD *)0x0,*(int64_t *)(local_28._0_8_ + 0x20),0,0,0,
                      "Creating");
    bVar2 = true;
    if (bVar1) goto LAB_00148bf6;
    unlink((path->_M_dataplus)._M_p);
  }
  bVar2 = false;
LAB_00148bf6:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
  }
  return bVar2;
}

Assistant:

bool CreateHddImage(const std::string& path, int nSizeMB_)
{
    bool f = false;

    // If no sector count is specified, use the size parameter
    auto total_size = (opt.sectors == -1) ?
        static_cast<int64_t>(nSizeMB_) << 20 :
        static_cast<int64_t>(opt.sectors) << 9;

    if (total_size < 4 * 1024 * 1024)
        throw util::exception("needs image size in MB (>=4) or sector count with -s");

    // Create the specified HDD image, ensuring we don't overwrite any existing file
    auto hdd = HDD::CreateDisk(path, total_size, nullptr, false);
    if (!hdd)
        Error("create");
    else
    {
        // Zero-fill up to the required sector count
        f = hdd->Copy(nullptr, hdd->total_sectors, 0, 0, 0, "Creating");

        // If anything went wrong, remove the new file
        if (!f)
            unlink(path.c_str());
    }

    return f;
}